

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void wake_pending_write(CManager_conflict cm,CMConnection conn,void *param)

{
  CMConnHandlerList p_Var1;
  CMConnHandlerList p_Var2;
  
  p_Var1 = conn->write_callbacks;
  do {
    p_Var2 = p_Var1;
    if (p_Var2->func == wake_pending_write) break;
    p_Var1 = p_Var2 + 1;
  } while (p_Var2->client_data != param);
  p_Var2->func = (CMCloseHandlerFunc)0x0;
  INT_CMCondition_signal(cm,(int)param);
  return;
}

Assistant:

static void
 wake_pending_write(CManager cm, CMConnection conn, void *param)
 {
     int cond = (int)(intptr_t)param;
     remove_pending_write_callback(conn, wake_pending_write, param);
     INT_CMCondition_signal(cm, cond);
 }